

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O0

float deqp::gls::destructiveMedian<float>(vector<float,_std::allocator<float>_> *data)

{
  float fVar1;
  size_type sVar2;
  reference pfVar3;
  iterator __first;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_48;
  float *local_40;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_38;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_30;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_28;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_20;
  iterator mid;
  vector<float,_std::allocator<float>_> *data_local;
  
  mid._M_current = (float *)data;
  local_28._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(data);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)mid._M_current);
  local_20 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator+(&local_28,sVar2 >> 1);
  local_30._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(mid._M_current);
  local_38._M_current = local_20._M_current;
  local_40 = (float *)std::vector<float,_std::allocator<float>_>::end(mid._M_current);
  std::nth_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            (local_30,local_38,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)local_40);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)mid._M_current);
  if ((sVar2 & 1) == 0) {
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_20);
    fVar1 = *pfVar3;
    __first = std::vector<float,_std::allocator<float>_>::begin(mid._M_current);
    local_48 = std::
               max_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                         (__first._M_current,local_20);
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_48);
    data_local._4_4_ = (fVar1 + *pfVar3) * 0.5;
  }
  else {
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_20);
    data_local._4_4_ = *pfVar3;
  }
  return data_local._4_4_;
}

Assistant:

float destructiveMedian (vector<T>& data)
{
	const typename vector<T>::iterator mid = data.begin()+data.size()/2;

	std::nth_element(data.begin(), mid, data.end());

	if (data.size()%2 == 0) // Even number of elements, need average of two centermost elements
		return (*mid + *std::max_element(data.begin(), mid))*0.5f; // Data is partially sorted around mid, mid is half an item after center
	else
		return *mid;
}